

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TimingCheckConditionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,TimingCheckConditionSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  TimingCheckConditionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->tripleAnd).kind;
    token._2_1_ = (this->tripleAnd).field_0x2;
    token.numFlags.raw = (this->tripleAnd).numFlags.raw;
    token.rawLen = (this->tripleAnd).rawLen;
    token.info = (this->tripleAnd).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax TimingCheckConditionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return tripleAnd;
        case 1: return expr.get();
        default: return nullptr;
    }
}